

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream *fout,char *envVar,cmMakefile *mf)

{
  cmState *this;
  char *pcVar1;
  char *pcVar2;
  cmake *pcVar3;
  long lVar4;
  ulong uVar5;
  ostream *poVar6;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  string local_88 [8];
  string valueToUse;
  char *cacheValue;
  allocator local_49;
  undefined1 local_48 [8];
  string cacheEntryName;
  char *envVarValue;
  cmMakefile *mf_local;
  char *envVar_local;
  cmGeneratedFileStream *fout_local;
  
  cacheEntryName.field_2._8_8_ = getenv(envVar);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"CMAKE_ECLIPSE_ENVVAR_",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=((string *)local_48,envVar);
  this = cmMakefile::GetState(mf);
  valueToUse.field_2._8_8_ = cmState::GetInitializedCacheValue(this,(string *)local_48);
  std::__cxx11::string::string(local_88);
  if ((cacheEntryName.field_2._8_8_ == 0) && (valueToUse.field_2._8_8_ == 0)) {
    std::__cxx11::string::operator=(local_88,"");
  }
  else if ((cacheEntryName.field_2._8_8_ == 0) || (valueToUse.field_2._8_8_ != 0)) {
    if ((cacheEntryName.field_2._8_8_ == 0) && (valueToUse.field_2._8_8_ != 0)) {
      std::__cxx11::string::operator=(local_88,(char *)valueToUse.field_2._8_8_);
    }
    else {
      std::__cxx11::string::operator=(local_88,(char *)valueToUse.field_2._8_8_);
      lVar4 = std::__cxx11::string::find((char *)local_88,cacheEntryName.field_2._8_8_);
      if (lVar4 == -1) {
        std::__cxx11::string::operator=(local_88,(char *)cacheEntryName.field_2._8_8_);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition(mf,(string *)local_48,pcVar1,pcVar2,STRING,true);
        pcVar3 = cmMakefile::GetCMakeInstance(mf);
        pcVar1 = cmMakefile::GetHomeOutputDirectory(mf);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,pcVar1,&local_d1);
        cmake::SaveCache(pcVar3,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
    }
  }
  else {
    std::__cxx11::string::operator=(local_88,(char *)cacheEntryName.field_2._8_8_);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition(mf,(string *)local_48,pcVar1,pcVar2,STRING,true);
    pcVar3 = cmMakefile::GetCMakeInstance(mf);
    pcVar1 = cmMakefile::GetHomeOutputDirectory(mf);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
    cmake::SaveCache(pcVar3,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)fout,envVar);
    poVar6 = std::operator<<(poVar6,"=");
    poVar6 = std::operator<<(poVar6,local_88);
    std::operator<<(poVar6,"|");
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream& fout,
                                            const char* envVar, cmMakefile* mf)
{
  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  const char* envVarValue = getenv(envVar);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue = mf->GetState()->GetInitializedCacheValue(
                                                       cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (envVarValue==0 && cacheValue==0)
    {
    // nothing known, do nothing
    valueToUse = "";
    }
  else if (envVarValue!=0 && cacheValue==0)
    {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmState::STRING,
                           true);
    mf->GetCMakeInstance()->SaveCache(mf->GetHomeOutputDirectory());
    }
  else if (envVarValue==0 && cacheValue!=0)
    {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
    }
  else
    {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos)
      {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmState::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(mf->GetHomeOutputDirectory());
      }
    }

  if (!valueToUse.empty())
    {
    fout << envVar << "=" << valueToUse << "|";
    }
}